

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductBase.h
# Opt level: O1

PlainObject * __thiscall Eigen::ProductBase::operator_cast_to_Matrix_(ProductBase *this)

{
  ProductBase *this_00;
  undefined8 *puVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  Index othersize;
  Scalar local_20;
  
  this_00 = this + 0x10;
  PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00,
             *(Index *)(*(long *)this + 8),1);
  lVar4 = *(long *)(this + 0x18);
  if (lVar4 < 0) {
    __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/preritj[P]Extended-Kalman-Filter/src/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x3f,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00,lVar4,1);
  lVar2 = *(long *)(this + 0x18);
  if (lVar2 == lVar4) {
    uVar3 = lVar2 - (lVar2 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < lVar2) {
      lVar4 = 0;
      do {
        puVar1 = (undefined8 *)(*(long *)this_00 + lVar4 * 8);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar4 = lVar4 + 2;
      } while (lVar4 < (long)uVar3);
    }
    if ((long)uVar3 < lVar2) {
      memset((void *)(*(long *)this_00 + (lVar2 / 2) * 0x10),0,lVar2 * 8 + (lVar2 / 2) * -0x10);
    }
    local_20 = 1.0;
    GeneralProduct<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,4>::
    scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,4>
                *)this,(Matrix<double,__1,_1,_0,__1,_1> *)this_00,&local_20);
    return (PlainObject *)this_00;
  }
  __assert_fail("rows() == other.rows() && cols() == other.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/preritj[P]Extended-Kalman-Filter/src/Eigen/src/Core/Assign.h"
                ,0x1f9,
                "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>]"
               );
}

Assistant:

operator const PlainObject& () const
    {
      m_result.resize(m_lhs.rows(), m_rhs.cols());
      derived().evalTo(m_result);
      return m_result;
    }